

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_285d7d::SndioPlayback::open(SndioPlayback *this,char *__file,int __oflag,...)

{
  ALCdevice *pAVar1;
  char *pcVar2;
  int iVar3;
  backend_exception *this_00;
  sio_hdl *psVar4;
  
  if (__file == (char *)0x0) {
    __file = "SndIO Default";
  }
  else {
    iVar3 = strcmp(__file,"SndIO Default");
    if (iVar3 != 0) {
      this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(this_00,0xa004,"Device name \"%s\" not found",__file)
      ;
      goto LAB_001652de;
    }
  }
  psVar4 = (sio_hdl *)sio_open(0,1,0);
  this->mSndHandle = psVar4;
  if (psVar4 != (sio_hdl *)0x0) {
    pAVar1 = (this->super_BackendBase).mDevice;
    pcVar2 = (char *)(pAVar1->DeviceName)._M_string_length;
    strlen(__file);
    iVar3 = std::__cxx11::string::_M_replace((ulong)&pAVar1->DeviceName,0,pcVar2,(ulong)__file);
    return iVar3;
  }
  this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
  al::backend_exception::backend_exception(this_00,0xa004,"Could not open backend device");
LAB_001652de:
  __cxa_throw(this_00,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void SndioPlayback::open(const ALCchar *name)
{
    if(!name)
        name = sndio_device;
    else if(strcmp(name, sndio_device) != 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};

    mSndHandle = sio_open(nullptr, SIO_PLAY, 0);
    if(mSndHandle == nullptr)
        throw al::backend_exception{ALC_INVALID_VALUE, "Could not open backend device"};

    mDevice->DeviceName = name;
}